

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O0

bool slang::ast::hasSimpleLabel(StatementSyntax *syntax)

{
  bool local_11;
  StatementSyntax *syntax_local;
  bool local_1;
  
  if (syntax->label == (NamedLabelSyntax *)0x0) {
    local_1 = false;
  }
  else {
    local_11 = false;
    if (((((syntax->super_SyntaxNode).kind != SequentialBlockStatement) &&
         (local_11 = false, (syntax->super_SyntaxNode).kind != ParallelBlockStatement)) &&
        (local_11 = false, (syntax->super_SyntaxNode).kind != ForLoopStatement)) &&
       (local_11 = false, (syntax->super_SyntaxNode).kind != ForeachLoopStatement)) {
      local_11 = (syntax->super_SyntaxNode).kind != RandSequenceStatement;
    }
    local_1 = local_11;
  }
  return local_1;
}

Assistant:

static bool hasSimpleLabel(const StatementSyntax& syntax) {
    if (!syntax.label)
        return false;

    return syntax.kind != SyntaxKind::SequentialBlockStatement &&
           syntax.kind != SyntaxKind::ParallelBlockStatement &&
           syntax.kind != SyntaxKind::ForLoopStatement &&
           syntax.kind != SyntaxKind::ForeachLoopStatement &&
           syntax.kind != SyntaxKind::RandSequenceStatement;
}